

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O0

void flatbuffers::tests::Offset64VectorOfStructs(void)

{
  bool expval;
  Offset<RootTable> root;
  uint expval_00;
  int32_t iVar1;
  size_t buffer_minalign;
  uint8_t *puVar2;
  SizeT buf_len;
  RootTable *this;
  Vector<const_LeafStruct_*,_unsigned_int> *pVVar3;
  size_type_conflict sVar4;
  return_type pLVar5;
  Vector64<const_LeafStruct_*> *pVVar6;
  unsigned_long expval_01;
  return_type pLVar7;
  double dVar8;
  RootTable *root_table;
  Verifier verifier;
  Options options;
  Offset<RootTable> root_table_offset;
  LeafStruct local_108;
  LeafStruct local_f8;
  undefined1 local_e8 [8];
  vector<LeafStruct,_std::allocator<LeafStruct>_> big_leaves;
  LeafStruct local_b0;
  undefined1 local_a0 [8];
  vector<LeafStruct,_std::allocator<LeafStruct>_> far_leaves;
  FlatBufferBuilder64 builder;
  
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<true>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)
             &far_leaves.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0x400,(Allocator *)0x0,false,buffer_minalign
            );
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::vector
            ((vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_a0);
  LeafStruct::LeafStruct(&local_b0,0x7b,4.567);
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::emplace_back<LeafStruct>
            ((vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_a0,&local_b0);
  LeafStruct::LeafStruct
            ((LeafStruct *)
             &big_leaves.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0x3db,6.543);
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::emplace_back<LeafStruct>
            ((vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_a0,
             (LeafStruct *)
             &big_leaves.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::vector
            ((vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_e8);
  LeafStruct::LeafStruct(&local_f8,0x48,72.8);
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::emplace_back<LeafStruct>
            ((vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_e8,&local_f8);
  LeafStruct::LeafStruct(&local_108,0x52,82.8);
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::emplace_back<LeafStruct>
            ((vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_e8,&local_108);
  LeafStruct::LeafStruct((LeafStruct *)&stack0xfffffffffffffee8,0x5c,92.8);
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::emplace_back<LeafStruct>
            ((vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_e8,
             (LeafStruct *)&stack0xfffffffffffffee8);
  root = CreateRootTableDirect
                   ((FlatBufferBuilder64 *)
                    &far_leaves.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,0,(char *)0x0,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,(char *)0x0,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                    (vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_a0,
                    (vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_e8,
                    (vector<flatbuffers::Offset<WrapperTable>,_std::allocator<flatbuffers::Offset<WrapperTable>_>_>
                     *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0);
  FlatBufferBuilderImpl<true>::Finish<RootTable>
            ((FlatBufferBuilderImpl<true> *)
             &far_leaves.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,root,(char *)0x0);
  VerifierTemplate<false>::Options::Options((Options *)&verifier.flex_reuse_tracker_);
  std::numeric_limits<long>::max();
  puVar2 = FlatBufferBuilderImpl<true>::GetBufferPointer
                     ((FlatBufferBuilderImpl<true> *)
                      &far_leaves.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  buf_len = FlatBufferBuilderImpl<true>::GetSize
                      ((FlatBufferBuilderImpl<true> *)
                       &far_leaves.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&root_table,puVar2,buf_len,
             (Options *)&verifier.flex_reuse_tracker_);
  expval = VerifyRootTableBuffer((Verifier *)&root_table);
  TestEq<bool,bool>(expval,true,"\'VerifyRootTableBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                    ,0x141,"");
  puVar2 = FlatBufferBuilderImpl<true>::GetBufferPointer
                     ((FlatBufferBuilderImpl<true> *)
                      &far_leaves.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  this = GetRootTable(puVar2);
  pVVar3 = RootTable::far_struct_vector(this);
  expval_00 = Vector<const_LeafStruct_*,_unsigned_int>::size(pVVar3);
  sVar4 = std::vector<LeafStruct,_std::allocator<LeafStruct>_>::size
                    ((vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_a0);
  TestEq<unsigned_int,unsigned_long>
            (expval_00,sVar4,"\'root_table->far_struct_vector()->size()\' != \'far_leaves.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x145,"");
  pVVar3 = RootTable::far_struct_vector(this);
  pLVar5 = Vector<const_LeafStruct_*,_unsigned_int>::Get(pVVar3,0);
  iVar1 = LeafStruct::a(pLVar5);
  TestEq<int,int>(iVar1,0x7b,"\'root_table->far_struct_vector()->Get(0)->a()\' != \'123\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                  ,0x146,"");
  pVVar3 = RootTable::far_struct_vector(this);
  pLVar5 = Vector<const_LeafStruct_*,_unsigned_int>::Get(pVVar3,0);
  dVar8 = LeafStruct::b(pLVar5);
  TestEq<double,double>
            (dVar8,4.567,"\'root_table->far_struct_vector()->Get(0)->b()\' != \'4.567\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x147,"");
  pVVar3 = RootTable::far_struct_vector(this);
  pLVar5 = Vector<const_LeafStruct_*,_unsigned_int>::Get(pVVar3,1);
  iVar1 = LeafStruct::a(pLVar5);
  TestEq<int,int>(iVar1,0x3db,"\'root_table->far_struct_vector()->Get(1)->a()\' != \'987\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                  ,0x148,"");
  pVVar3 = RootTable::far_struct_vector(this);
  pLVar5 = Vector<const_LeafStruct_*,_unsigned_int>::Get(pVVar3,1);
  dVar8 = LeafStruct::b(pLVar5);
  TestEq<double,double>
            (dVar8,6.543,"\'root_table->far_struct_vector()->Get(1)->b()\' != \'6.543\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x149,"");
  pVVar6 = RootTable::big_struct_vector(this);
  expval_01 = Vector<const_LeafStruct_*,_unsigned_long>::size(pVVar6);
  sVar4 = std::vector<LeafStruct,_std::allocator<LeafStruct>_>::size
                    ((vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_e8);
  TestEq<unsigned_long,unsigned_long>
            (expval_01,sVar4,"\'root_table->big_struct_vector()->size()\' != \'big_leaves.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x14b,"");
  pVVar6 = RootTable::big_struct_vector(this);
  pLVar7 = Vector<const_LeafStruct_*,_unsigned_long>::Get(pVVar6,0);
  iVar1 = LeafStruct::a(pLVar7);
  TestEq<int,int>(iVar1,0x48,"\'root_table->big_struct_vector()->Get(0)->a()\' != \'72\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                  ,0x14c,"");
  pVVar6 = RootTable::big_struct_vector(this);
  pLVar7 = Vector<const_LeafStruct_*,_unsigned_long>::Get(pVVar6,0);
  dVar8 = LeafStruct::b(pLVar7);
  TestEq<double,double>
            (dVar8,72.8,"\'root_table->big_struct_vector()->Get(0)->b()\' != \'72.8\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x14d,"");
  pVVar6 = RootTable::big_struct_vector(this);
  pLVar7 = Vector<const_LeafStruct_*,_unsigned_long>::Get(pVVar6,1);
  iVar1 = LeafStruct::a(pLVar7);
  TestEq<int,int>(iVar1,0x52,"\'root_table->big_struct_vector()->Get(1)->a()\' != \'82\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                  ,0x14e,"");
  pVVar6 = RootTable::big_struct_vector(this);
  pLVar7 = Vector<const_LeafStruct_*,_unsigned_long>::Get(pVVar6,1);
  dVar8 = LeafStruct::b(pLVar7);
  TestEq<double,double>
            (dVar8,82.8,"\'root_table->big_struct_vector()->Get(1)->b()\' != \'82.8\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x14f,"");
  pVVar6 = RootTable::big_struct_vector(this);
  pLVar7 = Vector<const_LeafStruct_*,_unsigned_long>::Get(pVVar6,2);
  iVar1 = LeafStruct::a(pLVar7);
  TestEq<int,int>(iVar1,0x5c,"\'root_table->big_struct_vector()->Get(2)->a()\' != \'92\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                  ,0x150,"");
  pVVar6 = RootTable::big_struct_vector(this);
  pLVar7 = Vector<const_LeafStruct_*,_unsigned_long>::Get(pVVar6,2);
  dVar8 = LeafStruct::b(pLVar7);
  TestEq<double,double>
            (dVar8,92.8,"\'root_table->big_struct_vector()->Get(2)->b()\' != \'92.8\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
             ,0x151,"");
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::~vector
            ((vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_e8);
  std::vector<LeafStruct,_std::allocator<LeafStruct>_>::~vector
            ((vector<LeafStruct,_std::allocator<LeafStruct>_> *)local_a0);
  FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<true> *)
             &far_leaves.super__Vector_base<LeafStruct,_std::allocator<LeafStruct>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Offset64VectorOfStructs() {
  FlatBufferBuilder64 builder;

  std::vector<LeafStruct> far_leaves;
  far_leaves.emplace_back(LeafStruct{ 123, 4.567 });
  far_leaves.emplace_back(LeafStruct{ 987, 6.543 });

  std::vector<LeafStruct> big_leaves;
  big_leaves.emplace_back(LeafStruct{ 72, 72.8 });
  big_leaves.emplace_back(LeafStruct{ 82, 82.8 });
  big_leaves.emplace_back(LeafStruct{ 92, 92.8 });

  // Add the two vectors of leaf structs.
  const Offset<RootTable> root_table_offset =
      CreateRootTableDirect(builder, nullptr, 0, nullptr, nullptr, nullptr,
                            nullptr, &far_leaves, &big_leaves);

  // Finish the buffer.
  builder.Finish(root_table_offset);

  Verifier::Options options;
  // Allow the verifier to verify 64-bit buffers.
  options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
  options.assert = true;

  Verifier verifier(builder.GetBufferPointer(), builder.GetSize(), options);

  TEST_EQ(VerifyRootTableBuffer(verifier), true);

  // Verify the data.
  const RootTable *root_table = GetRootTable(builder.GetBufferPointer());
  TEST_EQ(root_table->far_struct_vector()->size(), far_leaves.size());
  TEST_EQ(root_table->far_struct_vector()->Get(0)->a(), 123);
  TEST_EQ(root_table->far_struct_vector()->Get(0)->b(), 4.567);
  TEST_EQ(root_table->far_struct_vector()->Get(1)->a(), 987);
  TEST_EQ(root_table->far_struct_vector()->Get(1)->b(), 6.543);

  TEST_EQ(root_table->big_struct_vector()->size(), big_leaves.size());
  TEST_EQ(root_table->big_struct_vector()->Get(0)->a(), 72);
  TEST_EQ(root_table->big_struct_vector()->Get(0)->b(), 72.8);
  TEST_EQ(root_table->big_struct_vector()->Get(1)->a(), 82);
  TEST_EQ(root_table->big_struct_vector()->Get(1)->b(), 82.8);
  TEST_EQ(root_table->big_struct_vector()->Get(2)->a(), 92);
  TEST_EQ(root_table->big_struct_vector()->Get(2)->b(), 92.8);
}